

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ListFields
          (GeneratedMessageReflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  uint uVar1;
  uint *puVar2;
  uint32 *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  OneofDescriptor *this_01;
  char *pcVar6;
  ExtensionSet *this_02;
  iterator iVar7;
  iterator iVar8;
  int __c;
  uint32 *local_78;
  OneofDescriptor *containing_oneof;
  FieldDescriptor *field;
  uint *puStack_38;
  int i;
  uint32 *oneof_case_array;
  uint32 *has_bits_indices;
  uint32 *has_bits;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *output_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  has_bits = (uint32 *)output;
  output_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)message;
  message_local = (Message *)this;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear(output);
  bVar3 = ReflectionSchema::IsDefaultInstance(&this->schema_,(Message *)output_local);
  if (!bVar3) {
    bVar3 = ReflectionSchema::HasHasbits(&this->schema_);
    if (bVar3) {
      local_78 = GetHasBits(this,(Message *)output_local);
    }
    else {
      local_78 = (uint32 *)0x0;
    }
    has_bits_indices = local_78;
    oneof_case_array = (this->schema_).has_bit_indices_;
    puStack_38 = anon_unknown_0::GetConstRefAtOffset<unsigned_int>
                           ((Message *)output_local,(this->schema_).oneof_case_offset_);
    this_00 = has_bits;
    iVar4 = Descriptor::field_count(this->descriptor_);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)this_00,(long)iVar4);
    for (field._4_4_ = 0; (int)field._4_4_ <= this->last_non_weak_field_index_;
        field._4_4_ = field._4_4_ + 1) {
      pcVar6 = (char *)(ulong)field._4_4_;
      containing_oneof = (OneofDescriptor *)Descriptor::field(this->descriptor_,field._4_4_);
      bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)containing_oneof);
      if (bVar3) {
        iVar4 = FieldSize(this,(Message *)output_local,(FieldDescriptor *)containing_oneof);
        if (0 < iVar4) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)has_bits,(value_type *)&containing_oneof);
        }
      }
      else {
        this_01 = FieldDescriptor::containing_oneof((FieldDescriptor *)containing_oneof);
        puVar2 = puStack_38;
        if (this_01 == (OneofDescriptor *)0x0) {
          if (has_bits_indices == (uint32 *)0x0) {
            bVar3 = HasBit(this,(Message *)output_local,(FieldDescriptor *)containing_oneof);
            if (bVar3) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)has_bits,(value_type *)&containing_oneof);
            }
          }
          else {
            bVar3 = anon_unknown_0::IsIndexInHasBitSet
                              (has_bits_indices,oneof_case_array[(int)field._4_4_]);
            if (bVar3) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)has_bits,(value_type *)&containing_oneof);
            }
          }
        }
        else {
          pcVar6 = OneofDescriptor::index(this_01,pcVar6,__c);
          uVar1 = puVar2[(int)pcVar6];
          uVar5 = FieldDescriptor::number((FieldDescriptor *)containing_oneof);
          if (uVar1 == uVar5) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)has_bits,(value_type *)&containing_oneof);
          }
        }
      }
    }
    bVar3 = ReflectionSchema::HasExtensionSet(&this->schema_);
    if (bVar3) {
      this_02 = GetExtensionSet(this,(Message *)output_local);
      ExtensionSet::AppendToList
                (this_02,this->descriptor_,this->descriptor_pool_,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)has_bits);
    }
    iVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)has_bits);
    iVar8 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)has_bits);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::internal::(anonymous_namespace)::FieldNumberSorter>
              (iVar7._M_current,iVar8._M_current);
  }
  return;
}

Assistant:

void GeneratedMessageReflection::ListFields(
    const Message& message,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : NULL;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  const uint32* const oneof_case_array =
      &GetConstRefAtOffset<uint32>(message, schema_.oneof_case_offset_);
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}